

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O2

void __thiscall
QUnicodeTools::initScripts(QUnicodeTools *this,QStringView string,ScriptItemArray *scripts)

{
  ushort uVar1;
  uint uVar2;
  Properties *pPVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char32_t ucs4;
  Script SVar7;
  Script SVar8;
  Script SVar9;
  long in_FS_OFFSET;
  ScriptItem local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = 0;
  lVar5 = 0;
  SVar9 = Script_Common;
  while (lVar5 < (long)this) {
    uVar1 = *(ushort *)(string.m_size + lVar5 * 2);
    ucs4 = (char32_t)uVar1;
    lVar4 = lVar5;
    if ((((ucs4 & 0xfc00U) == 0xd800) && (lVar5 + 1 < (long)this)) &&
       (uVar2 = (uint)*(ushort *)(string.m_size + 2 + lVar5 * 2), (uVar2 & 0xfc00) == 0xdc00)) {
      ucs4 = (uint)uVar1 * 0x400 + uVar2 + L'\xfca02400';
      lVar4 = lVar5 + 1;
    }
    pPVar3 = QUnicodeTables::properties(ucs4);
    SVar7 = *(uint *)&pPVar3->field_0x10 >> 0x18;
    SVar8 = SVar9;
    if (((0x2ffffff < *(uint *)&pPVar3->field_0x10 && SVar7 != SVar9) &&
        (SVar8 = SVar7, Script_Common < SVar9)) && (SVar8 = SVar9, 2 < (*(uint *)pPVar3 & 0x1f))) {
      local_48.position = lVar6;
      local_48.script = SVar9;
      QVarLengthArray<QUnicodeTools::ScriptItem,_64LL>::emplace_back<QUnicodeTools::ScriptItem>
                ((QVarLengthArray<QUnicodeTools::ScriptItem,_64LL> *)string.m_data,&local_48);
      lVar6 = lVar5;
      SVar8 = SVar7;
    }
    SVar9 = SVar8;
    lVar5 = lVar4 + 1;
  }
  local_48.position = lVar6;
  local_48.script = SVar9;
  QVarLengthArray<QUnicodeTools::ScriptItem,_64LL>::emplace_back<QUnicodeTools::ScriptItem>
            ((QVarLengthArray<QUnicodeTools::ScriptItem,_64LL> *)string.m_data,&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_CORE_EXPORT void initScripts(QStringView string, ScriptItemArray *scripts)
{
    qsizetype sor = 0;
    qsizetype eor = 0;
    QChar::Script script = QChar::Script_Common;

    for (qsizetype i = 0; i < string.size(); ++i, eor = i) {
        char32_t ucs4 = string[i].unicode();
        if (QChar::isHighSurrogate(ucs4) && i + 1 < string.size()) {
            ushort low = string[i + 1].unicode();
            if (QChar::isLowSurrogate(low)) {
                ucs4 = QChar::surrogateToUcs4(ucs4, low);
                ++i;
            }
        }

        const QUnicodeTables::Properties *prop = QUnicodeTables::properties(ucs4);

        QChar::Script nscript = QChar::Script(prop->script);

        if (Q_LIKELY(nscript == script || nscript <= QChar::Script_Common))
            continue;

        // inherit preceding Common-s
        if (Q_UNLIKELY(script <= QChar::Script_Common)) {
            // also covers a case where the base character of Common script followed
            // by one or more combining marks of non-Inherited, non-Common script
            script = nscript;
            continue;
        }

        // Never break between a combining mark (gc= Mc, Mn or Me) and its base character.
        // Thus, a combining mark - whatever its script property value is - should inherit
        // the script property value of its base character.
        static const int test = (FLAG(QChar::Mark_NonSpacing) | FLAG(QChar::Mark_SpacingCombining) | FLAG(QChar::Mark_Enclosing));
        if (Q_UNLIKELY(FLAG(prop->category) & test))
            continue;

        Q_ASSERT(script > QChar::Script_Common);
        Q_ASSERT(sor < eor);
        scripts->append(ScriptItem{sor, script});
        sor = eor;

        script = nscript;
    }

    Q_ASSERT(script >= QChar::Script_Common);
    Q_ASSERT(eor == string.size());
    scripts->append(ScriptItem{sor, script});
}